

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O0

void __thiscall
diy::detail::ReductionFunctor<BlockT,_diy::detail::KDTreePartners>::operator()
          (ReductionFunctor<BlockT,_diy::detail::KDTreePartners> *this,BlockT *b,ProxyWithLink *cp)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_type sVar6;
  Proxy *in_RDX;
  int *in_RDI;
  BlockID target;
  const_iterator __end4;
  const_iterator __begin4;
  Neighbors *__range4;
  OutgoingQueues *outgoing;
  ReduceProxy rp;
  vector<int,_std::allocator<int>_> outgoing_gids;
  vector<int,_std::allocator<int>_> incoming_gids;
  KDTreePartners *__args_2;
  ReduceProxy *in_stack_fffffffffffffe10;
  BlockT *in_stack_fffffffffffffe18;
  Link *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe30;
  Master *in_stack_fffffffffffffe38;
  KDTreePartners *in_stack_fffffffffffffe40;
  Master *in_stack_fffffffffffffe48;
  KDTreePartners *in_stack_fffffffffffffe50;
  Master *in_stack_fffffffffffffe68;
  Assigner *in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe7c;
  Proxy *proxy;
  GIDVector *in_stack_fffffffffffffea0;
  __normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
  local_158;
  Neighbors *local_150;
  OutgoingQueues *local_148;
  ReduceProxy local_140;
  undefined1 local_48 [72];
  
  proxy = (Proxy *)(in_RDI + 10);
  iVar4 = *in_RDI;
  local_48._48_8_ = in_RDX;
  iVar3 = Master::Proxy::gid(in_RDX);
  Master::Proxy::master((Proxy *)local_48._48_8_);
  bVar2 = KDTreePartners::active
                    ((KDTreePartners *)in_stack_fffffffffffffe38,
                     (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),(int)in_stack_fffffffffffffe30,
                     (Master *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  if (bVar2) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x191209);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x191216);
    if (0 < *in_RDI) {
      in_stack_fffffffffffffe70 = (Assigner *)(in_RDI + 10);
      in_stack_fffffffffffffe7c = Master::Proxy::gid((Proxy *)local_48._48_8_);
      in_stack_fffffffffffffe68 = Master::Proxy::master((Proxy *)local_48._48_8_);
      KDTreePartners::incoming
                (in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                 (int)in_stack_fffffffffffffe48,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38);
    }
    iVar1 = *in_RDI;
    sVar5 = KDTreePartners::rounds((KDTreePartners *)0x1912ae);
    if (iVar1 < (int)sVar5) {
      in_stack_fffffffffffffe50 = (KDTreePartners *)(in_RDI + 10);
      Master::Proxy::gid((Proxy *)local_48._48_8_);
      in_stack_fffffffffffffe48 = Master::Proxy::master((Proxy *)local_48._48_8_);
      KDTreePartners::outgoing
                (in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 (int)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                 (Master *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
    __args_2 = (KDTreePartners *)local_48;
    ReduceProxy::ReduceProxy
              ((ReduceProxy *)CONCAT44(iVar3,iVar4),proxy,in_RDI,in_stack_fffffffffffffe7c,
               in_stack_fffffffffffffe70,(GIDVector *)in_stack_fffffffffffffe68,
               in_stack_fffffffffffffea0);
    std::function<void_(BlockT_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&)>::
    operator()((function<void_(BlockT_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&)>
                *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
               __args_2);
    local_148 = Master::Proxy::outgoing(&local_140.super_Proxy);
    sVar6 = std::
            map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
            ::size((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                    *)0x1913b2);
    ReduceProxy::out_link(&local_140);
    iVar4 = Link::size((Link *)0x1913d5);
    if (sVar6 < (ulong)(long)iVar4) {
      in_stack_fffffffffffffe20 = ReduceProxy::out_link(&local_140);
      local_150 = Link::neighbors(in_stack_fffffffffffffe20);
      local_158._M_current =
           (BlockID *)
           std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::begin
                     ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)__args_2);
      std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::end
                ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)__args_2);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                                 *)in_stack_fffffffffffffe10,
                                (__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                                 *)__args_2), bVar2) {
        __gnu_cxx::
        __normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
        ::operator*(&local_158);
        std::
        map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
        ::operator[]((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                      *)in_stack_fffffffffffffe50,(key_type *)in_stack_fffffffffffffe48);
        __gnu_cxx::
        __normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
        ::operator++(&local_158);
      }
    }
    ReduceProxy::~ReduceProxy(in_stack_fffffffffffffe10);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe20);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe20);
  }
  return;
}

Assistant:

void        operator()(Block* b, const Master::ProxyWithLink& cp) const
    {
      if (!partners.active(round, cp.gid(), *cp.master())) return;

      std::vector<int> incoming_gids, outgoing_gids;
      if (round > 0)
          partners.incoming(round, cp.gid(), incoming_gids, *cp.master());        // receive from the previous round
      if (round < static_cast<int>(partners.rounds()))
          partners.outgoing(round, cp.gid(), outgoing_gids, *cp.master());        // send to the next round

      ReduceProxy   rp(std::move(const_cast<Master::ProxyWithLink&>(cp)), b, round, assigner, incoming_gids, outgoing_gids);
      reduce(b, rp, partners);

      // touch the outgoing queues to make sure they exist
      Master::Proxy::OutgoingQueues& outgoing = *rp.outgoing();
      if (outgoing.size() < static_cast<size_t>(rp.out_link().size()))
        for (BlockID target : rp.out_link().neighbors())
          outgoing[target];       // touch the outgoing queue, creating it if necessary
    }